

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O3

bool board::makemove::move(Move *move,Board *pos)

{
  pointer *ppUVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  iterator __position;
  bool bVar7;
  ulong uVar8;
  int (*paiVar9) [10];
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  Undo local_58;
  Move *local_40;
  long local_38;
  ulong uVar19;
  
  uVar4 = move->value;
  uVar17 = uVar4 & 0x7f;
  uVar18 = uVar4 >> 7 & 0x7f;
  uVar19 = (ulong)uVar18;
  iVar5 = pos->side;
  local_58.fiftyMove = pos->fiftyMove;
  local_38 = (long)pos->board[uVar17];
  local_58.hashKey = pos->hashKey;
  uVar2 = pos->enPas;
  uVar3 = pos->castlePerm;
  local_58.enPas = uVar2;
  local_58.castlePerm = uVar3;
  local_58.moveValue = uVar4;
  local_40 = move;
  if ((uVar4 >> 0x12 & 1) == 0) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      if (uVar18 < 0x5d) {
        if (uVar18 == 0x17) {
          iVar11 = pos->board[0x15];
          iVar6 = Board::PIECE_COLOR[iVar11];
          uVar8 = local_58.hashKey ^ Board::PIECE_KEYS[iVar11][0x18];
          pos->hashKey = uVar8;
          pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar11][0x15];
          pos->board[0x15] = 0;
          pos->board[0x18] = iVar11;
          if (Board::PIECE_NO_TEAM[iVar11] == 1) {
            bitboard::clearBit(pos->pawns + iVar6,0);
            bitboard::clearBit(pos->pawns + 2,0);
            bitboard::setBit(pos->pawns + iVar6,3);
            bitboard::setBit(pos->pawns + 2,3);
          }
          if (0 < (long)pos->pNum[iVar11]) {
            lVar12 = 0;
            do {
              if (pos->pList[iVar11][lVar12] == 0x15) {
                pos->pList[iVar11][lVar12] = 0x18;
                break;
              }
              lVar12 = lVar12 + 1;
            } while (pos->pNum[iVar11] != lVar12);
          }
        }
        else if (uVar18 == 0x1b) {
          iVar11 = pos->board[0x1c];
          iVar6 = Board::PIECE_COLOR[iVar11];
          uVar8 = local_58.hashKey ^ Board::PIECE_KEYS[iVar11][0x1a];
          pos->hashKey = uVar8;
          pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar11][0x1c];
          pos->board[0x1c] = 0;
          pos->board[0x1a] = iVar11;
          if (Board::PIECE_NO_TEAM[iVar11] == 1) {
            bitboard::clearBit(pos->pawns + iVar6,7);
            bitboard::clearBit(pos->pawns + 2,7);
            bitboard::setBit(pos->pawns + iVar6,5);
            bitboard::setBit(pos->pawns + 2,5);
          }
          if (0 < (long)pos->pNum[iVar11]) {
            lVar12 = 0;
            do {
              if (pos->pList[iVar11][lVar12] == 0x1c) {
                pos->pList[iVar11][lVar12] = 0x1a;
                break;
              }
              lVar12 = lVar12 + 1;
            } while (pos->pNum[iVar11] != lVar12);
          }
        }
      }
      else if (uVar18 == 0x5d) {
        iVar11 = pos->board[0x5b];
        iVar6 = Board::PIECE_COLOR[iVar11];
        uVar8 = local_58.hashKey ^ Board::PIECE_KEYS[iVar11][0x5e];
        pos->hashKey = uVar8;
        pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar11][0x5b];
        pos->board[0x5b] = 0;
        pos->board[0x5e] = iVar11;
        if (Board::PIECE_NO_TEAM[iVar11] == 1) {
          bitboard::clearBit(pos->pawns + iVar6,0x38);
          bitboard::clearBit(pos->pawns + 2,0x38);
          bitboard::setBit(pos->pawns + iVar6,0x3b);
          bitboard::setBit(pos->pawns + 2,0x3b);
        }
        if (0 < (long)pos->pNum[iVar11]) {
          lVar12 = 0;
          do {
            if (pos->pList[iVar11][lVar12] == 0x5b) {
              pos->pList[iVar11][lVar12] = 0x5e;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (pos->pNum[iVar11] != lVar12);
        }
      }
      else if (uVar18 == 0x61) {
        iVar11 = pos->board[0x62];
        iVar6 = Board::PIECE_COLOR[iVar11];
        uVar8 = local_58.hashKey ^ Board::PIECE_KEYS[iVar11][0x60];
        pos->hashKey = uVar8;
        pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar11][0x62];
        pos->board[0x62] = 0;
        pos->board[0x60] = iVar11;
        if (Board::PIECE_NO_TEAM[iVar11] == 1) {
          bitboard::clearBit(pos->pawns + iVar6,0x3f);
          bitboard::clearBit(pos->pawns + 2,0x3f);
          bitboard::setBit(pos->pawns + iVar6,0x3d);
          bitboard::setBit(pos->pawns + 2,0x3d);
        }
        if (0 < (long)pos->pNum[iVar11]) {
          lVar12 = 0;
          do {
            if (pos->pList[iVar11][lVar12] == 0x62) {
              pos->pList[iVar11][lVar12] = 0x60;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (pos->pNum[iVar11] != lVar12);
        }
      }
    }
  }
  else {
    if (iVar5 == 0) {
      lVar12 = (long)pos->board[uVar19 - 10];
      iVar11 = Board::PIECE_COLOR[lVar12];
      pos->material[iVar11] = pos->material[iVar11] - Board::PIECE_VAL[lVar12];
      pos->hashKey = local_58.hashKey ^ *(ulong *)(&DAT_001457a0 + uVar19 * 8 + lVar12 * 0x3c0);
      pos->board[uVar19 - 10] = 0;
      if (Board::PIECE_NO_TEAM[lVar12] == 1) {
        iVar6 = Board::SQ64[uVar19 - 10];
        bitboard::clearBit(pos->pawns + iVar11,iVar6);
        bitboard::clearBit(pos->pawns + 2,iVar6);
      }
      paiVar9 = pos->pList + lVar12;
      lVar10 = (long)pos->pNum[lVar12];
      lVar13 = -1;
      if (0 < lVar10) {
        lVar16 = 0;
        do {
          lVar13 = lVar16;
          if ((*paiVar9)[lVar16] == (int)(uVar19 - 10)) break;
          lVar16 = lVar16 + 1;
          lVar13 = -1;
        } while (lVar10 != lVar16);
      }
    }
    else {
      uVar15 = uVar18 + 10;
      lVar12 = (long)pos->board[uVar15];
      iVar11 = Board::PIECE_COLOR[lVar12];
      pos->material[iVar11] = pos->material[iVar11] - Board::PIECE_VAL[lVar12];
      pos->hashKey = local_58.hashKey ^ Board::PIECE_KEYS[lVar12][uVar15];
      pos->board[uVar15] = 0;
      if (Board::PIECE_NO_TEAM[lVar12] == 1) {
        iVar6 = Board::SQ64[uVar19 + 10];
        bitboard::clearBit(pos->pawns + iVar11,iVar6);
        bitboard::clearBit(pos->pawns + 2,iVar6);
      }
      paiVar9 = pos->pList + lVar12;
      lVar10 = (long)pos->pNum[lVar12];
      lVar13 = -1;
      if (0 < lVar10) {
        lVar16 = 0;
        do {
          lVar13 = lVar16;
          if ((*paiVar9)[lVar16] == uVar15) break;
          lVar16 = lVar16 + 1;
          lVar13 = -1;
        } while (lVar10 != lVar16);
      }
    }
    pos->pNum[lVar12] = (int)lVar10 + -1;
    (*paiVar9)[lVar13] = *(int *)((long)(paiVar9 + -1) + (lVar10 + 9) * 4);
  }
  uVar8 = pos->hashKey;
  if ((long)pos->enPas != 99) {
    uVar8 = uVar8 ^ Board::PIECE_KEYS[0][pos->enPas];
    pos->hashKey = uVar8;
  }
  pos->hashKey = uVar8 ^ Board::CASTLE_KEYS[pos->castlePerm];
  __position._M_current =
       (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<board::Undo,std::allocator<board::Undo>>::_M_realloc_insert<board::Undo_const&>
              ((vector<board::Undo,std::allocator<board::Undo>> *)&pos->history,__position,&local_58
              );
  }
  else {
    (__position._M_current)->hashKey = local_58.hashKey;
    (__position._M_current)->castlePerm = local_58.castlePerm;
    (__position._M_current)->enPas = local_58.enPas;
    (__position._M_current)->fiftyMove = local_58.fiftyMove;
    (__position._M_current)->moveValue = local_58.moveValue;
    ppUVar1 = &(pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  uVar15 = pos->castlePerm & Board::CASTLE_PERM_MASK[uVar17] & Board::CASTLE_PERM_MASK[uVar19];
  pos->castlePerm = uVar15;
  uVar8 = pos->hashKey ^ Board::CASTLE_KEYS[(int)uVar15];
  pos->hashKey = uVar8;
  pos->enPas = 99;
  pos->fiftyMove = pos->fiftyMove + 1;
  if ((uVar4 & 0x3c000) != 0) {
    lVar12 = (long)pos->board[uVar19];
    iVar11 = Board::PIECE_COLOR[lVar12];
    pos->material[iVar11] = pos->material[iVar11] - Board::PIECE_VAL[lVar12];
    pos->hashKey = uVar8 ^ Board::PIECE_KEYS[lVar12][uVar19];
    pos->board[uVar19] = 0;
    if (Board::PIECE_NO_TEAM[lVar12] == 1) {
      iVar6 = Board::SQ64[uVar19];
      bitboard::clearBit(pos->pawns + iVar11,iVar6);
      bitboard::clearBit(pos->pawns + 2,iVar6);
    }
    lVar10 = (long)pos->pNum[lVar12];
    lVar13 = -1;
    if (0 < lVar10) {
      lVar16 = 0;
      do {
        lVar13 = lVar16;
        if (pos->pList[lVar12][lVar16] == uVar18) break;
        lVar16 = lVar16 + 1;
        lVar13 = -1;
      } while (lVar10 != lVar16);
    }
    pos->pNum[lVar12] = pos->pNum[lVar12] + -1;
    pos->pList[lVar12][lVar13] = pos->pList[lVar12 + -1][lVar10 + 9];
    pos->fiftyMove = 0;
  }
  pos->ply = pos->ply + 1;
  if (Board::PIECE_NO_TEAM[local_38] == 1) {
    pos->fiftyMove = 0;
    uVar8 = pos->hashKey;
    if ((local_40->value & 0x80000) != 0) {
      iVar11 = uVar17 + 10;
      if (iVar5 != 0) {
        iVar11 = uVar17 - 10;
      }
      pos->enPas = iVar11;
      uVar8 = uVar8 ^ Board::PIECE_KEYS[0][iVar11];
      pos->hashKey = uVar8;
    }
  }
  else {
    uVar8 = pos->hashKey;
  }
  iVar5 = pos->board[uVar17];
  iVar11 = Board::PIECE_COLOR[iVar5];
  uVar8 = uVar8 ^ Board::PIECE_KEYS[iVar5][uVar19];
  pos->hashKey = uVar8;
  pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar5][uVar17];
  pos->board[uVar17] = 0;
  pos->board[uVar19] = iVar5;
  if (Board::PIECE_NO_TEAM[iVar5] == 1) {
    iVar6 = Board::SQ64[uVar17];
    bitboard::clearBit(pos->pawns + iVar11,iVar6);
    bitboard::clearBit(pos->pawns + 2,iVar6);
    iVar6 = Board::SQ64[uVar19];
    bitboard::setBit(pos->pawns + iVar11,iVar6);
    bitboard::setBit(pos->pawns + 2,iVar6);
  }
  uVar15 = uVar4 >> 0x14 & 0xf;
  if (0 < (long)pos->pNum[iVar5]) {
    lVar12 = 0;
    do {
      if (pos->pList[iVar5][lVar12] == uVar17) {
        pos->pList[iVar5][lVar12] = uVar18;
        break;
      }
      lVar12 = lVar12 + 1;
    } while (pos->pNum[iVar5] != lVar12);
  }
  uVar8 = pos->hashKey;
  if ((uVar4 >> 0x14 & 0xf) != 0) {
    lVar12 = (long)pos->board[uVar19];
    iVar5 = Board::PIECE_COLOR[lVar12];
    pos->material[iVar5] = pos->material[iVar5] - Board::PIECE_VAL[lVar12];
    pos->hashKey = uVar8 ^ Board::PIECE_KEYS[lVar12][uVar19];
    pos->board[uVar19] = 0;
    if (Board::PIECE_NO_TEAM[lVar12] == 1) {
      iVar11 = Board::SQ64[uVar19];
      bitboard::clearBit(pos->pawns + iVar5,iVar11);
      bitboard::clearBit(pos->pawns + 2,iVar11);
    }
    lVar10 = (long)pos->pNum[lVar12];
    lVar13 = -1;
    if (0 < lVar10) {
      lVar16 = 0;
      do {
        lVar13 = lVar16;
        if (pos->pList[lVar12][lVar16] == uVar18) break;
        lVar16 = lVar16 + 1;
        lVar13 = -1;
      } while (lVar10 != lVar16);
    }
    pos->pNum[lVar12] = pos->pNum[lVar12] + -1;
    pos->pList[lVar12][lVar13] = pos->pList[lVar12 + -1][lVar10 + 9];
    uVar14 = (ulong)(uVar15 * 4);
    iVar5 = *(int *)((long)Board::PIECE_COLOR + uVar14);
    pos->material[iVar5] = pos->material[iVar5] + *(int *)((long)Board::PIECE_VAL + uVar14);
    pos->board[uVar19] = uVar15;
    uVar8 = pos->hashKey ^ Board::PIECE_KEYS[uVar15][uVar19];
    pos->hashKey = uVar8;
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar14) == 1) {
      iVar11 = Board::SQ64[uVar19];
      bitboard::setBit(pos->pawns + iVar5,iVar11);
      bitboard::setBit(pos->pawns + 2,iVar11);
      uVar8 = pos->hashKey;
    }
    pos->pList[uVar15][pos->pNum[uVar15]] = uVar18;
    pos->pNum[uVar15] = pos->pNum[uVar15] + 1;
  }
  uVar4 = pos->side;
  uVar17 = uVar4 ^ 1;
  pos->side = uVar17;
  pos->hashKey = uVar8 ^ Board::SIDE_KEY;
  if (uVar4 == 0) {
    bVar7 = Board::sqAttacked(pos,pos->pList[6][0],1);
    if (bVar7) goto LAB_0012ec1b;
    uVar17 = pos->side;
  }
  if (uVar17 != 0) {
    return true;
  }
  bVar7 = Board::sqAttacked(pos,pos->pList[0xc][0],0);
  if (!bVar7) {
    return true;
  }
LAB_0012ec1b:
  undo(pos);
  return false;
}

Assistant:

bool board::makemove::move(Move& move, Board& pos)
{
    int from = Move::FROMSQ(move.getValue());
    int to = Move::TOSQ(move.getValue());
    int captured = Move::CAPTURED(move.getValue());
    int promoted = Move::PROMOTED(move.getValue());
    int side = pos.getSide();
    int piece = pos.getSquare(from);
    int castle = pos.getCastlePerm();
    int enPas = pos.getEnPas();
    int fiftyMove = pos.getFiftyMove();
    uint64_t hash = pos.getHashKey();
    Undo current = Undo(castle, enPas, fiftyMove, move.getValue(), hash);
    if (move.getValue() & Move::MFLAGEP) {
        if (side == WHITE) {
            clearPiece(to - 10, pos);
        }
        else {
            clearPiece(to + 10, pos);
        }
    }
    else if (move.getValue() & Move::MFLAGCA) {
        if (to == C1) {
            movePiece(A1, D1, pos);
        }
        else if (to == C8) {
            movePiece(A8, D8, pos);
        }
        else if (to == G1) {
            movePiece(H1, F1, pos);
        }
        else if (to == G8) {
            movePiece(H8, F8, pos);
        }
    }
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.addHistory(current);
    pos.updateCastlePerm(to, from);
    pos.hashCastle();
    pos.clearEnPas();
    pos.incrementFiftyMove();
    if (captured != EMPTY) {
        clearPiece(to, pos);
        pos.resetFiftyMove();
    }
    pos.incrementPly();
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        pos.resetFiftyMove();
        if (move.getValue() & Move::MFLAGPS) {
            if (side == WHITE) {
                pos.setEnPas(from + 10);
            }
            else {
                pos.setEnPas(from - 10);
            }
            pos.hashEnPas();
        }
    }
    movePiece(from, to, pos);
    if (promoted != EMPTY) {
        clearPiece(to, pos);
        addPiece(promoted, to, pos);
    }
    pos.updateSide();
    pos.hashSide();
    if (pos.getSide() == BLACK && pos.sqAttacked(pos.getPieceList(WK)[0], BLACK)) {
        undo(pos);
        return false;
    }
    if (pos.getSide() == WHITE && pos.sqAttacked(pos.getPieceList(BK)[0], WHITE)) {
        undo(pos);
        return false;
    }
    return true;
}